

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntVectorType(ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  uint32_t id_00;
  Instruction *pIVar2;
  
  pIVar2 = FindDef(this,id);
  if ((pIVar2 != (Instruction *)0x0) && ((pIVar2->inst_).opcode == 0x17)) {
    id_00 = GetComponentType(this,id);
    bVar1 = IsUnsignedIntScalarType(this,id_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool ValidationState_t::IsUnsignedIntVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsUnsignedIntScalarType(GetComponentType(id));
  }

  return false;
}